

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::utils::ObjectNode::DumpNode(ObjectNode *node,string *buffer)

{
  bool bVar1;
  pointer ppVar2;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  _Self local_30;
  _Self local_28;
  const_iterator iterator;
  bool first;
  string *buffer_local;
  ObjectNode *node_local;
  
  std::__cxx11::string::operator+=((string *)buffer,'{');
  iterator._M_node._7_1_ = 1;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
       ::begin(&node->properties_map_);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
         ::end(&node->properties_map_);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    if ((iterator._M_node._7_1_ & 1) == 0) {
      std::__cxx11::string::operator+=((string *)buffer,',');
    }
    else {
      iterator._M_node._7_1_ = 0;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>
    ::operator->(&local_28);
    std::operator+((char)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x22);
    std::operator+(local_50,(char *)local_70);
    std::__cxx11::string::operator+=((string *)buffer,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string(local_70);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>
             ::operator->(&local_28);
    ValueNode::ToStr(&ppVar2->second,buffer);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>
    ::operator++(&local_28);
  }
  std::__cxx11::string::operator+=((string *)buffer,'}');
  return;
}

Assistant:

void ObjectNode::DumpNode(const ObjectNode &node, string *buffer) {
  *buffer += '{';
  bool first = true;

  for (std::map<string, ValueNode>::const_iterator
           iterator = node.properties_map_.begin();
       iterator != node.properties_map_.end(); ++iterator) {
    if (first) {
      first = false;
    } else {
      *buffer += ',';
    }
    *buffer += '"' + iterator->first + "\":";
    ValueNode::ToStr(iterator->second, buffer);
  }
  *buffer += '}';
}